

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::grabMouse(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScene *pQVar2;
  
  pQVar1 = (this->d_ptr).d;
  pQVar2 = pQVar1->scene;
  if (pQVar2 == (QGraphicsScene *)0x0) {
    grabMouse();
  }
  else {
    if ((pQVar1->field_0x160 & 0x20) != 0) {
      QGraphicsScenePrivate::grabMouse(*(QGraphicsScenePrivate **)&pQVar2->field_0x8,this,false);
      return;
    }
    grabMouse();
  }
  return;
}

Assistant:

void QGraphicsItem::grabMouse()
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::grabMouse: cannot grab mouse without scene");
        return;
    }
    if (!d_ptr->visible) {
        qWarning("QGraphicsItem::grabMouse: cannot grab mouse while invisible");
        return;
    }
    d_ptr->scene->d_func()->grabMouse(this);
}